

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

Gia_Man_t * Gia_QbfQuantifyOne(Gia_Man_t *p,int iVar,int fAndAll,int fOrAll)

{
  char *__s;
  Gia_Obj_t *pGVar1;
  bool bVar2;
  int iVar3;
  Gia_Man_t *p_00;
  size_t sVar4;
  char *__dest;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  Gia_Man_t *pGVar10;
  int iVar11;
  int iVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  
  p_00 = Gia_ManStart(p->nObjs);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar3 = p->nRegs;
  pVVar6 = p->vCis;
  iVar11 = pVVar6->nSize;
  if (iVar3 < iVar11) {
    lVar18 = 0;
    do {
      if (iVar11 <= lVar18) goto LAB_007978d0;
      iVar11 = pVVar6->pArray[lVar18];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_00797892;
      pGVar13 = p->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) break;
      pGVar5 = Gia_ManAppendObj(p_00);
      uVar9 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar9 | 0x9fffffff;
      *(ulong *)pGVar5 =
           uVar9 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar1 = p_00->pObjs;
      if ((pGVar5 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar5)) {
LAB_0079790e:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar1) >> 2) * -0x55555555);
      pGVar1 = p_00->pObjs;
      if ((pGVar5 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar5)) goto LAB_0079790e;
      pGVar13[iVar11].Value = (int)((ulong)((long)pGVar5 - (long)pGVar1) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      iVar3 = p->nRegs;
      pVVar6 = p->vCis;
      iVar11 = pVVar6->nSize;
    } while (lVar18 < iVar11 - iVar3);
  }
  iVar12 = p->vCos->nSize - iVar3;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar12 * 2 - 1U) {
    iVar11 = iVar12 * 2;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar11;
  uVar14 = 0;
  if (iVar11 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar6->pArray = piVar7;
  bVar2 = true;
  do {
    bVar16 = bVar2;
    iVar11 = p->vCis->nSize;
    if (iVar11 - iVar3 <= iVar) {
      __assert_fail("v < Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
    }
    if ((iVar < 0) || (iVar11 <= iVar)) goto LAB_007978d0;
    iVar3 = p->vCis->pArray[(uint)iVar];
    if (((long)iVar3 < 0) || (iVar11 = p->nObjs, iVar11 <= iVar3)) {
LAB_00797892:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar13 = p->pObjs;
    pGVar13[iVar3].Value = uVar14;
    if (pGVar13 != (Gia_Obj_t *)0x0) {
      lVar18 = 0;
      do {
        uVar9 = *(ulong *)pGVar13;
        if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
          if ((int)pGVar13[-(uVar9 & 0x1fffffff)].Value < 0) goto LAB_007978b1;
          uVar14 = (uint)(uVar9 >> 0x20);
          if ((int)pGVar13[-(ulong)(uVar14 & 0x1fffffff)].Value < 0) goto LAB_007978b1;
          uVar14 = Gia_ManHashAnd(p_00,pGVar13[-(uVar9 & 0x1fffffff)].Value ^
                                       (uint)(uVar9 >> 0x1d) & 1,
                                  pGVar13[-(ulong)(uVar14 & 0x1fffffff)].Value ^ uVar14 >> 0x1d & 1)
          ;
          pGVar13->Value = uVar14;
          iVar11 = p->nObjs;
        }
        lVar18 = lVar18 + 1;
      } while ((lVar18 < iVar11) && (pGVar13 = p->pObjs + lVar18, p->pObjs != (Gia_Obj_t *)0x0));
    }
    iVar3 = p->nRegs;
    pVVar8 = p->vCos;
    iVar11 = pVVar8->nSize;
    if (iVar3 < iVar11) {
      lVar18 = 0;
      do {
        if (iVar11 <= lVar18) goto LAB_007978d0;
        iVar11 = pVVar8->pArray[lVar18];
        if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_00797892;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar13 = p->pObjs + iVar11;
        uVar15 = (uint)*(undefined8 *)pGVar13;
        uVar14 = pGVar13[-(ulong)(uVar15 & 0x1fffffff)].Value;
        if ((int)uVar14 < 0) {
LAB_007978b1:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Vec_IntPush(pVVar6,uVar15 >> 0x1d & 1 ^ uVar14);
        lVar18 = lVar18 + 1;
        iVar3 = p->nRegs;
        pVVar8 = p->vCos;
        iVar11 = pVVar8->nSize;
      } while (lVar18 < iVar11 - iVar3);
    }
    uVar14 = 1;
    bVar2 = false;
  } while (bVar16);
  if (fAndAll == 0) {
    if (fOrAll == 0) {
      iVar3 = pVVar6->nSize;
      if (0 < (long)iVar3) {
        piVar7 = pVVar6->pArray;
        lVar18 = 0;
        do {
          Gia_ManAppendCo(p_00,piVar7[lVar18]);
          lVar18 = lVar18 + 1;
        } while (iVar3 != lVar18);
      }
    }
    else {
      uVar14 = pVVar8->nSize - iVar3;
      uVar9 = (ulong)uVar14;
      if (uVar14 != 0 && iVar3 <= pVVar8->nSize) {
        uVar14 = pVVar6->nSize;
        uVar19 = 0;
        uVar17 = 0;
        if (0 < (int)uVar14) {
          uVar17 = (ulong)uVar14;
        }
        do {
          if ((uVar17 == uVar19) || (uVar9 = (uVar9 & 0xffffffff) + uVar19, uVar14 <= uVar9))
          goto LAB_007978d0;
          iVar3 = Gia_ManHashOr(p_00,pVVar6->pArray[uVar19],pVVar6->pArray[uVar9]);
          Gia_ManAppendCo(p_00,iVar3);
          uVar19 = uVar19 + 1;
          uVar9 = (long)p->vCos->nSize - (long)p->nRegs;
        } while ((long)uVar19 < (long)uVar9);
      }
    }
  }
  else {
    uVar14 = pVVar8->nSize - iVar3;
    uVar9 = (ulong)uVar14;
    if (uVar14 != 0 && iVar3 <= pVVar8->nSize) {
      uVar14 = pVVar6->nSize;
      uVar19 = 0;
      uVar17 = 0;
      if (0 < (int)uVar14) {
        uVar17 = (ulong)uVar14;
      }
      do {
        if ((uVar17 == uVar19) || (uVar9 = (uVar9 & 0xffffffff) + uVar19, uVar14 <= uVar9)) {
LAB_007978d0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = Gia_ManHashAnd(p_00,pVVar6->pArray[uVar19],pVVar6->pArray[uVar9]);
        Gia_ManAppendCo(p_00,iVar3);
        uVar19 = uVar19 + 1;
        uVar9 = (long)p->vCos->nSize - (long)p->nRegs;
      } while ((long)uVar19 < (long)uVar9);
    }
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
  }
  free(pVVar6);
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_QbfQuantifyOne( Gia_Man_t * p, int iVar, int fAndAll, int fOrAll )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCofs;
    int i, c;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // compute cofactors
    vCofs = Vec_IntAlloc( 2 * Gia_ManPoNum(p) );
    for ( c = 0; c < 2; c++ )
    {
        Gia_ManPi(p, iVar)->Value = c;
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vCofs, Gia_ObjFanin0Copy(pObj) );
    }
    if ( fAndAll )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
            Gia_ManAppendCo( pNew, Gia_ManHashAnd(pNew, Vec_IntEntry(vCofs, i), Vec_IntEntry(vCofs, Gia_ManPoNum(p)+i)) );
    }
    else if ( fOrAll )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
            Gia_ManAppendCo( pNew, Gia_ManHashOr(pNew, Vec_IntEntry(vCofs, i), Vec_IntEntry(vCofs, Gia_ManPoNum(p)+i)) );
    }
    else
    {
        Vec_IntForEachEntry( vCofs, c, i )
            Gia_ManAppendCo( pNew, c );
    }
    Vec_IntFree( vCofs );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}